

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

void __thiscall
Parser::WaitForBackgroundJobs(Parser *this,BackgroundParser *bgp,CompileScriptException *pse)

{
  int iVar1;
  LocalFunctionId LVar2;
  StmtNest *pSVar3;
  code *pcVar4;
  bool bVar5;
  uint *puVar6;
  JobProcessor *pJVar7;
  undefined4 *puVar8;
  BackgroundJobProcessor *this_00;
  CCLock *this_01;
  BackgroundParseItem *job;
  bool succeeded_1;
  CriticalSection *pcs;
  bool succeeded;
  StmtNest *pstmtSave;
  uint functionIdSave;
  uint blockIdSave;
  BackgroundParseItem *item;
  CompileScriptException *pse_local;
  BackgroundParser *bgp_local;
  Parser *this_local;
  
  puVar6 = BackgroundParser::GetPendingBackgroundItemsPtr(bgp);
  if (*puVar6 != 0) {
    this->m_isInBackground = true;
    SetCurrBackgroundParseItem(this,(BackgroundParseItem *)0x0);
    iVar1 = this->m_nextBlockId;
    LVar2 = *this->m_nextFunctionId;
    pSVar3 = this->m_pstmtCur;
    pJVar7 = JsUtil::JobManager::Processor((JobManager *)bgp);
    bVar5 = JsUtil::JobProcessor::ProcessesInBackground(pJVar7);
    if (bVar5) {
      this_00 = (BackgroundJobProcessor *)JsUtil::JobManager::Processor((JobManager *)bgp);
      this_01 = &JsUtil::BackgroundJobProcessor::GetCriticalSection(this_00)->super_CCLock;
      CCLock::Enter(this_01);
      while (job = BackgroundParser::GetNextUnprocessedItem(bgp), job != (BackgroundParseItem *)0x0)
      {
        pJVar7 = JsUtil::JobManager::Processor((JobManager *)bgp);
        (*pJVar7->_vptr_JobProcessor[3])(pJVar7,job);
        CCLock::Leave(this_01);
        bVar5 = BackgroundParser::Process(bgp,&job->super_Job,this,pse);
        CCLock::Enter(this_01);
        BackgroundParser::JobProcessed(bgp,&job->super_Job,bVar5);
      }
      CCLock::Leave(this_01);
      do {
        puVar6 = BackgroundParser::GetPendingBackgroundItemsPtr(bgp);
      } while (*puVar6 != 0);
    }
    else {
      _functionIdSave = BackgroundParser::GetNextUnprocessedItem(bgp);
      while (_functionIdSave != (BackgroundParseItem *)0x0) {
        pJVar7 = JsUtil::JobManager::Processor((JobManager *)bgp);
        (*pJVar7->_vptr_JobProcessor[3])(pJVar7,_functionIdSave);
        bVar5 = BackgroundParser::Process(bgp,&_functionIdSave->super_Job,this,pse);
        BackgroundParser::JobProcessed(bgp,&_functionIdSave->super_Job,bVar5);
        _functionIdSave = BackgroundParser::GetNextUnprocessedItem(bgp);
      }
      puVar6 = BackgroundParser::GetPendingBackgroundItemsPtr(bgp);
      if (*puVar6 != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                           ,0x26a,"(!*bgp->GetPendingBackgroundItemsPtr())",
                           "!*bgp->GetPendingBackgroundItemsPtr()");
        if (!bVar5) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
    }
    puVar6 = BackgroundParser::GetPendingBackgroundItemsPtr(bgp);
    if (*puVar6 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x28c,"(!*bgp->GetPendingBackgroundItemsPtr())",
                         "!*bgp->GetPendingBackgroundItemsPtr()");
      if (!bVar5) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    this->m_pstmtCur = pSVar3;
    this->m_isInBackground = false;
    this->m_nextBlockId = iVar1;
    *this->m_nextFunctionId = LVar2;
  }
  return;
}

Assistant:

void Parser::WaitForBackgroundJobs(BackgroundParser *bgp, CompileScriptException *pse)
{
    // The scan of the script is done, but there may be unfinished background jobs in the queue.
    // Enlist the main thread to help with those.
    BackgroundParseItem *item;
    if (!*bgp->GetPendingBackgroundItemsPtr())
    {
        // We're done.
        return;
    }

    // Save parser state, since we'll need to restore it in order to bind references correctly later.
    this->m_isInBackground = true;
    this->SetCurrBackgroundParseItem(nullptr);
    uint blockIdSave = this->m_nextBlockId;
    uint functionIdSave = *this->m_nextFunctionId;
    StmtNest *pstmtSave = this->m_pstmtCur;

    if (!bgp->Processor()->ProcessesInBackground())
    {
        // No background thread. Just walk the jobs with no locking and process them.
        for (item = bgp->GetNextUnprocessedItem(); item; item = bgp->GetNextUnprocessedItem())
        {
            bgp->Processor()->RemoveJob(item);
            bool succeeded = bgp->Process(item, this, pse);
            bgp->JobProcessed(item, succeeded);
        }
        Assert(!*bgp->GetPendingBackgroundItemsPtr());
    }
    else
    {
        // Background threads. We need to have the critical section in order to:
        // - Check for unprocessed jobs;
        // - Remove jobs from the processor queue;
        // - Do JobsProcessed work (such as removing jobs from the BackgroundParser's unprocessed list).
        CriticalSection *pcs = static_cast<JsUtil::BackgroundJobProcessor*>(bgp->Processor())->GetCriticalSection();
        pcs->Enter();
        for (;;)
        {
            // Grab a job (in lock)
            item = bgp->GetNextUnprocessedItem();
            if (item == nullptr)
            {
                break;
            }
            bgp->Processor()->RemoveJob(item);
            pcs->Leave();

            // Process job (if there is one) (outside lock)
            bool succeeded = bgp->Process(item, this, pse);

            pcs->Enter();
            bgp->JobProcessed(item, succeeded);
        }
        pcs->Leave();

        // Wait for the background threads to finish jobs they're already processing (if any).
        // TODO: Replace with a proper semaphore.
        while (*bgp->GetPendingBackgroundItemsPtr());
    }

    Assert(!*bgp->GetPendingBackgroundItemsPtr());

    // Restore parser state.
    this->m_pstmtCur = pstmtSave;
    this->m_isInBackground = false;
    this->m_nextBlockId = blockIdSave;
    *this->m_nextFunctionId = functionIdSave;
}